

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O2

void __thiscall EventQueue::Remove(EventQueue *this,Event *ev)

{
  iterator iVar1;
  Node *pNVar2;
  iterator i;
  AutoLock _auto_lock_;
  iterator local_40;
  AutoLock local_38;
  
  AutoLock::AutoLock(&local_38,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventQueue.cpp"
                     ,0x92);
  iVar1.mNode = ((this->mQueue).mHead)->next;
LAB_00118180:
  if (iVar1.mNode == (this->mQueue).mTail) {
    AutoLock::~AutoLock(&local_38);
    return;
  }
  pNVar2 = iVar1.mNode;
  if ((iVar1.mNode)->val == ev) goto LAB_0011819b;
  goto LAB_00118191;
LAB_0011819b:
  RefCount::Release(&(iVar1.mNode)->val->super_RefCount);
  JetHead::list<Event_*>::iterator::erase(&local_40);
  iVar1.mNode = local_40.mNode;
  if (local_40.mNode != (Node *)0x0) {
    pNVar2 = (local_40.mNode)->prev;
    iVar1.mNode = (Node *)0x0;
    if (pNVar2 != (Node *)0x0) {
LAB_00118191:
      iVar1.mNode = pNVar2->next;
    }
  }
  goto LAB_00118180;
}

Assistant:

void EventQueue::Remove( Event *ev )
{
	DebugAutoLock( mLock );

	for (JetHead::list<Event*>::iterator i = mQueue.begin(); i != mQueue.end(); ++i)
	{
		if ((*i) == ev)
		{
			(*i)->Release();
			i = i.erase();
			--i;
		}
	}	
}